

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

void __thiscall sptk::reaper::EpochTracker::CreatePeriodLattice(EpochTracker *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  short sVar7;
  short sVar8;
  int iVar9;
  int32_t iVar10;
  int32_t iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  size_type sVar15;
  reference pvVar16;
  reference pvVar17;
  int *piVar18;
  int *piVar19;
  reference pvVar20;
  reference ppEVar21;
  value_type *ppEVar22;
  int iVar23;
  long in_RDI;
  float fVar24;
  double dVar25;
  int32_t peak_cc_index_1;
  float lcc_value;
  int32_t lcc_index;
  float llevel_cost;
  EpochCand *uv_cand_1;
  size_t start_peak;
  size_t pcand;
  size_t lowest_index;
  float lowest_cost_1;
  int32_t uv_hyps_found;
  size_t pp;
  float local_cost;
  float peak_qual_cost;
  float period_cost;
  float level_cost;
  float per_dev_cost;
  int32_t peak_cc_index;
  float cc_value;
  int32_t cc_index;
  EpochCand *v_cand;
  float test_diff;
  int32_t nccf_period;
  size_t cc_peak_ind;
  float min_period_diff;
  int32_t cc_peak;
  float fperiod;
  int32_t iperiod;
  size_t npeak;
  int32_t next_cands_created;
  EpochCand *uv_cand;
  float best_cc_val;
  int32_t best_nccf_period;
  float time;
  float lowest_cost;
  int32_t max_period;
  int32_t min_period;
  size_t resid_index;
  size_t frame_index;
  size_t peak;
  int32_t high_period;
  int32_t low_period;
  value_type *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffec4;
  float local_dc;
  value_type *local_c0;
  value_type *local_b8;
  float local_b0;
  int local_ac;
  ulong local_a8;
  float local_88;
  ulong local_70;
  float local_68;
  int local_64;
  ulong local_58;
  int local_4c;
  float local_34;
  ulong local_18;
  
  iVar10 = RoundUp(*(float *)(in_RDI + 0x128) / *(float *)(in_RDI + 0x16c));
  iVar11 = RoundUp(*(float *)(in_RDI + 0x128) / *(float *)(in_RDI + 0x168));
  local_18 = 0;
  do {
    sVar15 = std::
             vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
             ::size((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                     *)(in_RDI + 8));
    if (sVar15 <= local_18) {
      return;
    }
    pvVar16 = std::
              vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
              ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                            *)(in_RDI + 8),local_18);
    iVar14 = pvVar16->frame_index;
    pvVar16 = std::
              vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
              ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                            *)(in_RDI + 8),local_18);
    iVar9 = pvVar16->resid_index;
    local_34 = 1e+30;
    pvVar16 = std::
              vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
              ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                            *)(in_RDI + 8),local_18);
    pvVar17 = std::vector<short,_std::allocator<short>_>::operator[](&pvVar16->nccf_periods,0);
    sVar7 = *pvVar17;
    pvVar16 = std::
              vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
              ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                            *)(in_RDI + 8),local_18);
    std::vector<float,_std::allocator<float>_>::operator[]
              (&pvVar16->nccf,(long)((int)sVar7 - *(int *)(in_RDI + 0x138)));
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (value_type_conflict2 *)in_stack_fffffffffffffeb8);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (value_type_conflict2 *)in_stack_fffffffffffffeb8);
    piVar18 = (int *)operator_new(0x20);
    *(undefined1 *)(piVar18 + 7) = 0;
    iVar23 = (int)local_18;
    piVar18[3] = iVar23;
    piVar18[2] = 0;
    piVar18[1] = 0;
    piVar18[5] = -1;
    local_4c = 0;
    local_58 = local_18;
    do {
      do {
        local_58 = local_58 + 1;
        sVar15 = std::
                 vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                 ::size((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                         *)(in_RDI + 8));
        if (sVar15 <= local_58) goto LAB_00122685;
        pvVar16 = std::
                  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                  ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                *)(in_RDI + 8),local_58);
        iVar12 = pvVar16->resid_index - iVar9;
        pvVar16 = std::
                  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                  ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                *)(in_RDI + 8),local_58);
      } while (pvVar16->resid_index < iVar9 + iVar10);
      fVar24 = (float)iVar12;
      local_64 = 0;
      dVar25 = std::log((double)(ulong)(uint)(fVar24 / (float)(int)sVar7));
      dVar25 = std::fabs(dVar25);
      local_68 = SUB84(dVar25,0);
      local_70 = 1;
      while( true ) {
        pvVar16 = std::
                  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                  ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                *)(in_RDI + 8),local_18);
        sVar15 = std::vector<short,_std::allocator<short>_>::size(&pvVar16->nccf_periods);
        if (sVar15 <= local_70) break;
        pvVar16 = std::
                  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                  ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                *)(in_RDI + 8),local_18);
        pvVar17 = std::vector<short,_std::allocator<short>_>::operator[]
                            (&pvVar16->nccf_periods,local_70);
        dVar25 = std::log((double)(ulong)(uint)(fVar24 / (float)(int)*pvVar17));
        dVar25 = std::fabs(dVar25);
        if (SUB84(dVar25,0) < local_68) {
          local_64 = (int)local_70;
          local_68 = SUB84(dVar25,0);
        }
        local_70 = local_70 + 1;
      }
      piVar19 = (int *)operator_new(0x20);
      *(undefined1 *)(piVar19 + 7) = 1;
      *piVar19 = iVar12;
      iVar13 = iVar12 - *(int *)(in_RDI + 0x138);
      if ((iVar13 < 0) || (*(int *)(in_RDI + 0x13c) <= iVar13)) {
        pvVar16 = std::
                  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                  ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                *)(in_RDI + 8),local_18);
        pvVar17 = std::vector<short,_std::allocator<short>_>::operator[]
                            (&pvVar16->nccf_periods,(long)local_64);
        sVar8 = *pvVar17;
        iVar13 = *(int *)(in_RDI + 0x138);
        pvVar16 = std::
                  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                  ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                *)(in_RDI + 8),local_18);
        pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                            (&pvVar16->nccf,(long)(sVar8 - iVar13));
        local_88 = *pvVar20;
      }
      else {
        pvVar16 = std::
                  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                  ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                *)(in_RDI + 8),local_18);
        pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                            (&pvVar16->nccf,(long)iVar13);
        local_88 = *pvVar20;
      }
      fVar1 = *(float *)(in_RDI + 0x1d0);
      fVar2 = *(float *)(in_RDI + 0x1e4);
      pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)(in_RDI + 0xe0),(long)iVar14);
      fVar3 = *pvVar20;
      fVar4 = *(float *)(in_RDI + 0x1e0);
      fVar5 = *(float *)(in_RDI + 0x1d4);
      pvVar16 = std::
                vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                              *)(in_RDI + 8),local_58);
      fVar6 = pvVar16->peak_quality;
      pvVar16 = std::
                vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                              *)(in_RDI + 8),local_18);
      fVar24 = (1.0 - local_88) + fVar1 * local_68 + fVar5 / (fVar6 + pvVar16->peak_quality) +
               fVar2 * (1.0 - fVar3) + fVar24 * fVar4 + *(float *)(in_RDI + 0x1cc);
      piVar19[1] = (int)fVar24;
      if (fVar24 < local_34) {
        *piVar18 = iVar12;
        fVar1 = *(float *)(in_RDI + 0x1e4);
        pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)(in_RDI + 0xe0),(long)iVar14);
        piVar18[1] = (int)(*(float *)(in_RDI + 0x1dc) * local_88 + fVar1 * *pvVar20 +
                           *(float *)(in_RDI + 0x1d8) + *(float *)(in_RDI + 0x1cc));
        piVar18[4] = (int)local_58;
        pvVar16 = std::
                  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                  ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                *)(in_RDI + 8),local_18);
        pvVar17 = std::vector<short,_std::allocator<short>_>::operator[]
                            (&pvVar16->nccf_periods,(long)local_64);
        piVar18[6] = (int)*pvVar17;
        local_34 = fVar24;
      }
      piVar19[3] = iVar23;
      piVar19[4] = (int)local_58;
      pvVar16 = std::
                vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                              *)(in_RDI + 8),local_18);
      pvVar17 = std::vector<short,_std::allocator<short>_>::operator[]
                          (&pvVar16->nccf_periods,(long)local_64);
      piVar19[6] = (int)*pvVar17;
      piVar19[2] = 0;
      piVar19[5] = -1;
      std::
      vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
      ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                    *)(in_RDI + 8),local_18);
      std::
      vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
      ::push_back((vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                   *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  in_stack_fffffffffffffeb8);
      std::
      vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
      ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                    *)(in_RDI + 8),local_58);
      std::
      vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
      ::push_back((vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                   *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  in_stack_fffffffffffffeb8);
      local_4c = local_4c + 1;
      pvVar16 = std::
                vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                              *)(in_RDI + 8),local_58);
    } while (pvVar16->resid_index < iVar9 + iVar11);
LAB_00122685:
    if (local_4c == 0) {
      if (piVar18 != (int *)0x0) {
        operator_delete(piVar18);
      }
    }
    else {
      std::
      vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
      ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                    *)(in_RDI + 8),local_18);
      std::
      vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
      ::push_back((vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                   *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  in_stack_fffffffffffffeb8);
      std::
      vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
      ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                    *)(in_RDI + 8),(long)piVar18[4]);
      std::
      vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
      ::push_back((vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                   *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  in_stack_fffffffffffffeb8);
    }
    pvVar16 = std::
              vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
              ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                            *)(in_RDI + 8),local_18);
    sVar15 = std::
             vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
             ::size(&pvVar16->past);
    if (sVar15 == 0) {
      local_a8 = 0;
      while( true ) {
        pvVar16 = std::
                  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                  ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                *)(in_RDI + 8),local_18);
        sVar15 = std::
                 vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                 ::size(&pvVar16->future);
        if (sVar15 <= local_a8) break;
        pvVar16 = std::
                  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                  ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                *)(in_RDI + 8),local_18);
        ppEVar21 = std::
                   vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                   ::operator[](&pvVar16->future,local_a8);
        in_stack_fffffffffffffec4 = (*ppEVar21)->local_cost;
        pvVar16 = std::
                  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                  ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                *)(in_RDI + 8),local_18);
        ppEVar21 = std::
                   vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                   ::operator[](&pvVar16->future,local_a8);
        (*ppEVar21)->cost_sum = in_stack_fffffffffffffec4;
        pvVar16 = std::
                  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                  ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                *)(in_RDI + 8),local_18);
        ppEVar21 = std::
                   vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                   ::operator[](&pvVar16->future,local_a8);
        (*ppEVar21)->best_prev_cand = -1;
        local_a8 = local_a8 + 1;
      }
    }
    else {
      local_ac = 0;
      pvVar16 = std::
                vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                              *)(in_RDI + 8),local_18);
      ppEVar21 = std::
                 vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                 ::operator[](&pvVar16->past,0);
      local_b0 = (*ppEVar21)->local_cost;
      local_b8 = (value_type *)0x0;
      local_c0 = (value_type *)0x0;
      while( true ) {
        in_stack_fffffffffffffeb8 = local_c0;
        pvVar16 = std::
                  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                  ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                *)(in_RDI + 8),local_18);
        ppEVar22 = (value_type *)
                   std::
                   vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                   ::size(&pvVar16->past);
        if (ppEVar22 <= in_stack_fffffffffffffeb8) break;
        pvVar16 = std::
                  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                  ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                *)(in_RDI + 8),local_18);
        ppEVar21 = std::
                   vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                   ::operator[](&pvVar16->past,(size_type)local_c0);
        if (((*ppEVar21)->voiced & 1U) == 0) {
          local_ac = local_ac + 1;
        }
        else {
          pvVar16 = std::
                    vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                    ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                  *)(in_RDI + 8),local_18);
          ppEVar21 = std::
                     vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                     ::operator[](&pvVar16->past,(size_type)local_c0);
          if ((*ppEVar21)->local_cost < local_b0) {
            local_b8 = local_c0;
            pvVar16 = std::
                      vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                      ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                    *)(in_RDI + 8),local_18);
            ppEVar21 = std::
                       vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                       ::operator[](&pvVar16->past,(size_type)local_c0);
            local_b0 = (*ppEVar21)->local_cost;
          }
        }
        local_c0 = (value_type *)((long)local_c0 + 1);
      }
      if (local_ac == 0) {
        pvVar16 = std::
                  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                  ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                *)(in_RDI + 8),local_18);
        ppEVar21 = std::
                   vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                   ::operator[](&pvVar16->past,(size_type)local_b8);
        iVar14 = (*ppEVar21)->start_peak;
        sVar15 = (size_type)iVar14;
        piVar18 = (int *)operator_new(0x20);
        *(undefined1 *)(piVar18 + 7) = 0;
        piVar18[3] = iVar14;
        piVar18[4] = iVar23;
        pvVar16 = std::
                  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                  ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                *)(in_RDI + 8),local_18);
        ppEVar21 = std::
                   vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                   ::operator[](&pvVar16->past,(size_type)local_b8);
        *piVar18 = (*ppEVar21)->period;
        pvVar16 = std::
                  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                  ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                *)(in_RDI + 8),local_18);
        ppEVar21 = std::
                   vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                   ::operator[](&pvVar16->past,(size_type)local_b8);
        piVar18[6] = (*ppEVar21)->closest_nccf_period;
        piVar18[2] = 0;
        piVar18[1] = 0;
        piVar18[5] = -1;
        fVar24 = *(float *)(in_RDI + 0x1e4);
        pvVar16 = std::
                  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                  ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                *)(in_RDI + 8),sVar15);
        pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)(in_RDI + 0xe0),
                             (long)pvVar16->frame_index);
        fVar1 = *pvVar20;
        iVar14 = *piVar18 - *(int *)(in_RDI + 0x138);
        if ((iVar14 < 0) || (*(int *)(in_RDI + 0x13c) <= iVar14)) {
          iVar14 = piVar18[6];
          iVar9 = *(int *)(in_RDI + 0x138);
          pvVar16 = std::
                    vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                    ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                  *)(in_RDI + 8),sVar15);
          pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                              (&pvVar16->nccf,(long)(iVar14 - iVar9));
          local_dc = *pvVar20;
        }
        else {
          pvVar16 = std::
                    vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                    ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                  *)(in_RDI + 8),sVar15);
          pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                              (&pvVar16->nccf,(long)iVar14);
          local_dc = *pvVar20;
        }
        piVar18[1] = (int)(*(float *)(in_RDI + 0x1dc) * local_dc + fVar24 * fVar1 +
                           *(float *)(in_RDI + 0x1d8) + *(float *)(in_RDI + 0x1cc));
        std::
        vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
        ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                      *)(in_RDI + 8),sVar15);
        std::
        vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
        ::push_back((vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                     *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    in_stack_fffffffffffffeb8);
        std::
        vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
        ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                      *)(in_RDI + 8),local_18);
        std::
        vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
        ::push_back((vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                     *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    in_stack_fffffffffffffeb8);
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void EpochTracker::CreatePeriodLattice(void) {
  int32_t low_period = RoundUp(sample_rate_ / max_f0_search_);
  int32_t high_period = RoundUp(sample_rate_ / min_f0_search_);
#if 0
  int32_t total_cands = 0;
#endif

  //  For each pulse in the normalized residual...
  for (size_t peak = 0; peak < resid_peaks_.size(); ++peak) {
    size_t frame_index = resid_peaks_[peak].frame_index;
    size_t resid_index = resid_peaks_[peak].resid_index;
    int32_t min_period = resid_index + low_period;
    int32_t max_period = resid_index + high_period;
    float lowest_cost = 1.0e30;
    float time = resid_index / sample_rate_;
    int32_t best_nccf_period = resid_peaks_[peak].nccf_periods[0];
    float best_cc_val =
        resid_peaks_[peak].nccf[best_nccf_period - first_nccf_lag_];
    best_corr_.push_back(time);
    best_corr_.push_back(best_cc_val);
    EpochCand* uv_cand = new EpochCand;  // pre-allocate an unvoiced candidate.
    uv_cand->voiced = false;
    uv_cand->start_peak = peak;
    uv_cand->cost_sum = 0.0;
    uv_cand->local_cost = 0.0;
    uv_cand->best_prev_cand = -1;
    int32_t next_cands_created = 0;
    // For each of the next residual pulses in the search range...
    for (size_t npeak = peak + 1; npeak < resid_peaks_.size(); ++npeak) {
      int32_t iperiod = resid_peaks_[npeak].resid_index - resid_index;
      if (resid_peaks_[npeak].resid_index >= min_period) {
        float fperiod = iperiod;
        // Find the NCCF period that most closely matches.
        int32_t cc_peak = 0;
        float min_period_diff = fabs(log(fperiod / best_nccf_period));
        for (size_t cc_peak_ind = 1;
             cc_peak_ind < resid_peaks_[peak].nccf_periods.size();
             ++cc_peak_ind) {
          int32_t nccf_period =  resid_peaks_[peak].nccf_periods[cc_peak_ind];
          float test_diff = fabs(log(fperiod / nccf_period));
          if (test_diff < min_period_diff) {
            min_period_diff = test_diff;
            cc_peak = cc_peak_ind;
          }
        }
        // Generate a forward-period candidate.  Grade the candidate
        // on closeness to a NCCF period hyp, value of the NCCF,
        // values of the candidate endpoint peaks.
        EpochCand* v_cand = new EpochCand;
        v_cand->voiced = true;
        v_cand->period = iperiod;
        int32_t cc_index = iperiod - first_nccf_lag_;
        float cc_value = 0.0;
        // If this period is in the normal search range, retrieve the
        // actual NCCF value for that lag.
        if ((cc_index >= 0) && (cc_index < n_nccf_lags_)) {
          cc_value = resid_peaks_[peak].nccf[cc_index];
        } else {  // punt and use the "closest" nccf peak
          int32_t peak_cc_index = resid_peaks_[peak].nccf_periods[cc_peak] -
              first_nccf_lag_;
          cc_value =  resid_peaks_[peak].nccf[peak_cc_index];
        }
        float per_dev_cost = period_deviation_wt_ * min_period_diff;
        float level_cost = level_wt_ * (1.0 - prob_voiced_[frame_index]);
        float period_cost = fperiod * period_wt_;
        float peak_qual_cost = peak_quality_wt_ /
            (resid_peaks_[npeak].peak_quality + resid_peaks_[peak].peak_quality);
        float local_cost =  (1.0 - cc_value) + per_dev_cost + peak_qual_cost +
            level_cost + period_cost + reward_;
        v_cand->local_cost = local_cost;
        if (local_cost < lowest_cost) {
          lowest_cost = local_cost;
          // Evaluate this best voiced period as an unvoiced
          // hypothesis.  (There are always plenty of poor
          // voiced candidates!)
          uv_cand->period = iperiod;
          level_cost = level_wt_ * prob_voiced_[frame_index];
          uv_cand->local_cost = (nccf_uv_peak_wt_ * cc_value) +
              level_cost + unvoiced_cost_ + reward_;
          uv_cand->end_peak = npeak;
          uv_cand->closest_nccf_period =
              resid_peaks_[peak].nccf_periods[cc_peak];
        }
        v_cand->start_peak = peak;
        v_cand->end_peak = npeak;
        v_cand->closest_nccf_period = resid_peaks_[peak].nccf_periods[cc_peak];
        v_cand->cost_sum = 0.0;
        v_cand->best_prev_cand = -1;
        resid_peaks_[peak].future.push_back(v_cand);
        resid_peaks_[npeak].past.push_back(v_cand);
#if 0
        total_cands++;
#endif
        next_cands_created++;
        if (resid_peaks_[npeak].resid_index >= max_period) {
          break;  // Exit the search only after at least one peak has
          // been found, even if it is necessary to go beyond
          // the nominal maximum period.
        }
      }  // end if this period is >= minimum search period.
    }  // end for each next pulse in the global period-search range.
    // Install the unvoiced candidate for this pulse.
    if (next_cands_created) {  // Register the unvoiced hyp iff there
      // was at least one voiced hyp.
      resid_peaks_[peak].future.push_back(uv_cand);
      resid_peaks_[uv_cand->end_peak].past.push_back(uv_cand);
#if 0
      total_cands++;
#endif
    } else {
      delete uv_cand;
    }
    // Now all residual-pulse period hyps that start at the current
    // pulse have been generated.

    // If this pulse is one of the first few in the residual that had
    // no possible preceeding periods, mark it as an origin.
    if (resid_peaks_[peak].past.size() == 0) {  // Is this pulse an origin?
      for (size_t pp = 0; pp < resid_peaks_[peak].future.size(); ++pp) {
        resid_peaks_[peak].future[pp]->cost_sum =
            resid_peaks_[peak].future[pp]->local_cost;
        resid_peaks_[peak].future[pp]->best_prev_cand = -1;
      }
    } else {  // There are previous period hyps to consider...
      // Check if at least one UV hyp is included in the period hyps
      // that end on this peak.  If there are none, generate one by
      // cloning the best voiced hyp in the collection, but score it
      // as unvoiced.
      int32_t uv_hyps_found = 0;
      float lowest_cost =  resid_peaks_[peak].past[0]->local_cost;
      size_t lowest_index = 0;
      for (size_t pcand = 0; pcand < resid_peaks_[peak].past.size(); ++pcand) {
        if (!resid_peaks_[peak].past[pcand]->voiced) {
          uv_hyps_found++;
        } else {
          if (resid_peaks_[peak].past[pcand]->local_cost < lowest_cost) {
            lowest_index = pcand;
            lowest_cost = resid_peaks_[peak].past[pcand]->local_cost;
          }
        }
      }
      if (!uv_hyps_found) {  // clone an UV hyp from the best V hyp found.
        size_t start_peak = resid_peaks_[peak].past[lowest_index]->start_peak;
        EpochCand* uv_cand = new EpochCand;
        uv_cand->voiced = false;
        uv_cand->start_peak = start_peak;
        uv_cand->end_peak = peak;
        uv_cand->period =  resid_peaks_[peak].past[lowest_index]->period;
        uv_cand->closest_nccf_period =
            resid_peaks_[peak].past[lowest_index]->closest_nccf_period;
        uv_cand->cost_sum = 0.0;
        uv_cand->local_cost = 0.0;
        uv_cand->best_prev_cand = -1;
        float llevel_cost = level_wt_ *
            prob_voiced_[resid_peaks_[start_peak].frame_index];
        int32_t lcc_index = uv_cand->period - first_nccf_lag_;
        float lcc_value = 0.0;
        // If this period is in the normal search range, retrieve the
        // actual NCCF value for that lag.
        if ((lcc_index >= 0) && (lcc_index < n_nccf_lags_)) {
          lcc_value = resid_peaks_[start_peak].nccf[lcc_index];
        } else {
          int32_t peak_cc_index = uv_cand->closest_nccf_period - first_nccf_lag_;
          lcc_value =  resid_peaks_[start_peak].nccf[peak_cc_index];
        }
        uv_cand->local_cost = (nccf_uv_peak_wt_ * lcc_value) + llevel_cost +
            unvoiced_cost_ + reward_;
        resid_peaks_[start_peak].future.push_back(uv_cand);
        resid_peaks_[peak].past.push_back(uv_cand);
#if 0
        total_cands++;
#endif
      }
    }
  }  // end of the first pass at all pulses in the residual.
  // All forward period hypotheses that start on all residual pulses
  // in the signal have now been generated, and both voiced and
  // unvoiced continuity throughout the lattice of hyps have been
  // assured.
}